

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__hdr_test_core(stbi__context *s,char *signature)

{
  stbi_uc *psVar1;
  stbi_uc *psVar2;
  char cVar3;
  int iVar4;
  stbi_uc *psVar5;
  stbi_uc *psVar6;
  byte bVar7;
  char *pcVar8;
  
  if (*signature != '\0') {
    psVar1 = s->buffer_start;
    psVar2 = s->buffer_start + 1;
    psVar6 = s->img_buffer;
    psVar5 = s->img_buffer_end;
    pcVar8 = signature + 1;
    do {
      if (psVar6 < psVar5) {
        s->img_buffer = psVar6 + 1;
        bVar7 = *psVar6;
        psVar6 = psVar6 + 1;
      }
      else if (s->read_from_callbacks == 0) {
        bVar7 = 0;
      }
      else {
        iVar4 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
        s->callback_already_read =
             s->callback_already_read + (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
        if (iVar4 == 0) {
          s->read_from_callbacks = 0;
          s->buffer_start[0] = '\0';
          bVar7 = 0;
          psVar5 = psVar2;
        }
        else {
          bVar7 = *psVar1;
          psVar5 = psVar1 + iVar4;
        }
        s->img_buffer_end = psVar5;
        s->img_buffer = psVar2;
        psVar6 = psVar2;
      }
      if ((uint)bVar7 != (int)pcVar8[-1]) {
        return 0;
      }
      cVar3 = *pcVar8;
      pcVar8 = pcVar8 + 1;
    } while (cVar3 != '\0');
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  return 1;
}

Assistant:

static int stbi__hdr_test_core(stbi__context *s, const char *signature)
{
   int i;
   for (i=0; signature[i]; ++i)
      if (stbi__get8(s) != signature[i])
          return 0;
   stbi__rewind(s);
   return 1;
}